

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<ON_SurfaceCurvature>::Append
          (ON_SimpleArray<ON_SurfaceCurvature> *this,ON_SurfaceCurvature *x)

{
  double dVar1;
  uint uVar2;
  ON_SurfaceCurvature *pOVar3;
  ON_SurfaceCurvature *pOVar4;
  uint uVar5;
  
  uVar2 = this->m_count;
  pOVar3 = x;
  if (uVar2 == this->m_capacity) {
    if ((int)uVar2 < 8 || (ulong)((long)(int)uVar2 * 0x10) < 0x10000001) {
      uVar5 = 4;
      if (2 < (int)uVar2) {
        uVar5 = uVar2 * 2;
      }
    }
    else {
      uVar5 = 0x1000008;
      if (uVar2 < 0x1000008) {
        uVar5 = uVar2;
      }
      uVar5 = uVar5 + uVar2;
    }
    if (x < this->m_a + (int)uVar2 && this->m_a <= x) {
      pOVar3 = (ON_SurfaceCurvature *)onmalloc(0x10);
      dVar1 = x->k2;
      pOVar3->k1 = x->k1;
      pOVar3->k2 = dVar1;
      uVar2 = this->m_capacity;
    }
    if (uVar2 < uVar5) {
      SetCapacity(this,(long)(int)uVar5);
    }
    pOVar4 = this->m_a;
    if (pOVar4 == (ON_SurfaceCurvature *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    uVar2 = this->m_count;
  }
  else {
    pOVar4 = this->m_a;
  }
  this->m_count = uVar2 + 1;
  dVar1 = pOVar3->k2;
  pOVar4[(int)uVar2].k1 = pOVar3->k1;
  pOVar4[(int)uVar2].k2 = dVar1;
  if (pOVar3 == x) {
    return;
  }
  onfree(pOVar3);
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}